

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall xercesc_4_0::AbstractDOMParser::reset(AbstractDOMParser *this)

{
  MemoryManager *pMVar1;
  DOMDocumentImpl *pDVar2;
  BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl> *this_00;
  XMLSize_t XVar3;
  int iVar4;
  XMLSize_t index;
  RefVectorOf<xercesc_4_0::DOMDocumentImpl> *pRVar5;
  undefined4 extraout_var;
  long lVar6;
  
  if ((this->fDocument != (DOMDocumentImpl *)0x0) && (this->fDocumentAdoptedByUser == false)) {
    if (this->fDocumentVector == (RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)0x0) {
      pRVar5 = (RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
      pMVar1 = this->fMemoryManager;
      (pRVar5->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>)._vptr_BaseRefVectorOf =
           (_func_int **)&PTR__BaseRefVectorOf_00417050;
      (pRVar5->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>).fAdoptedElems = true;
      (pRVar5->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>).fCurCount = 0;
      (pRVar5->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>).fMaxCount = 10;
      (pRVar5->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>).fElemList =
           (DOMDocumentImpl **)0x0;
      (pRVar5->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>).fMemoryManager = pMVar1;
      iVar4 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x50);
      (pRVar5->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>).fElemList =
           (DOMDocumentImpl **)CONCAT44(extraout_var,iVar4);
      lVar6 = 0;
      do {
        (pRVar5->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>).fElemList[lVar6] =
             (DOMDocumentImpl *)0x0;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 10);
      (pRVar5->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>)._vptr_BaseRefVectorOf =
           (_func_int **)&PTR__RefVectorOf_00416fd8;
      this->fDocumentVector = pRVar5;
    }
    pDVar2 = this->fDocument;
    this_00 = &this->fDocumentVector->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>;
    BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>::ensureExtraCapacity(this_00,1);
    XVar3 = this_00->fCurCount;
    this_00->fElemList[XVar3] = pDVar2;
    this_00->fCurCount = XVar3 + 1;
  }
  this->fDocument = (DOMDocumentImpl *)0x0;
  (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x1c])(this);
  this->fWithinElement = false;
  this->fDocumentAdoptedByUser = false;
  this->fCurrentParent = (DOMNode *)0x0;
  this->fCurrentNode = (DOMNode *)0x0;
  this->fCurrentEntity = (DOMEntityImpl *)0x0;
  this->fInternalSubset->fIndex = 0;
  return;
}

Assistant:

void AbstractDOMParser::reset()
{
    // if fDocument exists already, store the old pointer in the vector for deletion later
    if (fDocument && !fDocumentAdoptedByUser) {
        if (!fDocumentVector) {
            // allocate the vector if not exists yet
            fDocumentVector  = new (fMemoryManager) RefVectorOf<DOMDocumentImpl>(10, true, fMemoryManager) ;
        }
        fDocumentVector->addElement(fDocument);
    }

    fDocument = 0;
    resetDocType();
    fCurrentParent   = 0;
    fCurrentNode     = 0;
    fCurrentEntity   = 0;
    fWithinElement   = false;
    fDocumentAdoptedByUser = false;
    fInternalSubset.reset();
}